

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.cpp
# Opt level: O0

void NULLCDynamic::OverrideFunction(NULLCRef dest,NULLCRef src)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  char *pcVar3;
  FastVector<char,_false,_false> *pFVar4;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined4 in_stack_0000001c;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    if (pEVar1->subCat == CAT_FUNCTION) {
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                          dest.ptr._4_4_);
      if (pEVar1->subCat == CAT_FUNCTION) {
        if (in_stack_00000008 == dest.ptr._4_4_) {
          nullcRedirectFunction
                    (*(uint *)(CONCAT124(dest,in_stack_0000000c) + 8),
                     *(uint *)(CONCAT44(src.typeID,in_stack_0000001c) + 8));
        }
        else {
          pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
          pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                             ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                              dest.ptr._4_4_);
          pcVar2 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
          pFVar4 = (FastVector<char,_false,_false> *)(linker + 0x290);
          pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                             ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                              in_stack_00000008);
          pcVar3 = FastVector<char,_false,_false>::operator[](pFVar4,pEVar1->offsetToName);
          nullcThrowError("Cannot convert from \'%s\' to \'%s\'",pcVar2,pcVar3);
        }
      }
      else {
        nullcThrowError("Source variable is not a function");
      }
    }
    else {
      nullcThrowError("Destination variable is not a function");
    }
    return;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/dynamic.cpp"
                ,0xf,"void NULLCDynamic::OverrideFunction(NULLCRef, NULLCRef)");
}

Assistant:

void OverrideFunction(NULLCRef dest, NULLCRef src)
	{
		assert(linker);
		if(linker->exTypes[dest.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Destination variable is not a function");
			return;
		}
		if(linker->exTypes[src.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("Source variable is not a function");
			return;
		}
		if(dest.typeID != src.typeID)
		{
			nullcThrowError("Cannot convert from '%s' to '%s'", &linker->exSymbols[linker->exTypes[src.typeID].offsetToName], &linker->exSymbols[linker->exTypes[dest.typeID].offsetToName]);
			return;
		}

		nullcRedirectFunction(((NULLCFuncPtr*)dest.ptr)->id, ((NULLCFuncPtr*)src.ptr)->id);
	}